

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voice.cpp
# Opt level: O0

float * anon_unknown.dwarf_1ed9bb::LoadBufferQueue
                  (BufferlistItem *BufferListItem,BufferlistItem *BufferLoopItem,size_t NumChannels,
                  size_t SampleSize,size_t chan,size_t DataPosInt,
                  span<float,_18446744073709551615UL> SrcBuffer)

{
  BufferStorage *pBVar1;
  bool bVar2;
  index_type a;
  span<float,_18446744073709551615UL> *this;
  byte *pbVar3;
  iterator pfVar4;
  long in_RCX;
  long in_RDX;
  __pointer_type in_RSI;
  __pointer_type in_RDI;
  long in_R8;
  ulong in_R9;
  byte *Data;
  size_t DataSize;
  BufferStorage *Buffer;
  byte local_61;
  span<float,_18446744073709551615UL> *this_00;
  span<float,_18446744073709551615UL> in_stack_ffffffffffffffa8;
  unkbyte9 Var5;
  size_t srcstep;
  ulong local_30;
  __pointer_type local_8;
  
  this_00 = (span<float,_18446744073709551615UL> *)&stack0x00000008;
  local_30 = in_R9;
  local_8 = in_RDI;
  while( true ) {
    local_61 = 0;
    if (local_8 != (__pointer_type)0x0) {
      bVar2 = al::span<float,_18446744073709551615UL>::empty(this_00);
      local_61 = bVar2 ^ 0xff;
    }
    if ((local_61 & 1) == 0) break;
    pBVar1 = local_8->mBuffer;
    if ((pBVar1 == (BufferStorage *)0x0) || (pBVar1->mSampleLen <= local_30)) {
      if (pBVar1 != (BufferStorage *)0x0) {
        local_30 = local_30 - pBVar1->mSampleLen;
      }
      local_8 = std::atomic<BufferlistItem_*>::load
                          ((atomic<BufferlistItem_*> *)in_stack_ffffffffffffffa8.mData,
                           (memory_order)((ulong)this_00 >> 0x20));
      if (local_8 == (__pointer_type)0x0) {
        local_8 = in_RSI;
      }
    }
    else {
      a = al::span<float,_18446744073709551615UL>::size(this_00);
      Var5 = in_stack_ffffffffffffffa8._7_9_;
      this = (span<float,_18446744073709551615UL> *)minz(a,pBVar1->mSampleLen - local_30);
      pbVar3 = std::vector<al::byte,_al::allocator<al::byte,_16UL>_>::data
                         ((vector<al::byte,_al::allocator<al::byte,_16UL>_> *)0x222139);
      pbVar3 = pbVar3 + (local_30 * in_RDX + in_R8) * in_RCX;
      al::span<float,_18446744073709551615UL>::data(this_00);
      srcstep = (size_t)((unkuint9)Var5 >> 8);
      LoadSamples((float *)this,pbVar3,srcstep,(FmtType)Var5,(size_t)this_00);
      in_stack_ffffffffffffffa8 =
           al::span<float,_18446744073709551615UL>::subspan(this,(size_t)pbVar3,srcstep);
      this_00->mData = in_stack_ffffffffffffffa8.mData;
      this_00->mDataEnd = in_stack_ffffffffffffffa8.mDataEnd;
      bVar2 = al::span<float,_18446744073709551615UL>::empty(this_00);
      if (bVar2) break;
      local_30 = 0;
      local_8 = std::atomic<BufferlistItem_*>::load
                          ((atomic<BufferlistItem_*> *)in_stack_ffffffffffffffa8.mData,
                           (memory_order)((ulong)this_00 >> 0x20));
      if (local_8 == (__pointer_type)0x0) {
        local_8 = in_RSI;
      }
    }
  }
  pfVar4 = al::span<float,_18446744073709551615UL>::begin(this_00);
  return pfVar4;
}

Assistant:

float *LoadBufferQueue(BufferlistItem *BufferListItem, BufferlistItem *BufferLoopItem,
    const size_t NumChannels, const size_t SampleSize, const size_t chan, size_t DataPosInt,
    al::span<float> SrcBuffer)
{
    /* Crawl the buffer queue to fill in the temp buffer */
    while(BufferListItem && !SrcBuffer.empty())
    {
        BufferStorage *Buffer{BufferListItem->mBuffer};
        if(!(Buffer && DataPosInt < Buffer->mSampleLen))
        {
            if(Buffer) DataPosInt -= Buffer->mSampleLen;
            BufferListItem = BufferListItem->mNext.load(std::memory_order_acquire);
            if(!BufferListItem) BufferListItem = BufferLoopItem;
            continue;
        }

        const size_t DataSize{minz(SrcBuffer.size(), Buffer->mSampleLen-DataPosInt)};

        const al::byte *Data{Buffer->mData.data()};
        Data += (DataPosInt*NumChannels + chan)*SampleSize;

        LoadSamples(SrcBuffer.data(), Data, NumChannels, Buffer->mType, DataSize);
        SrcBuffer = SrcBuffer.subspan(DataSize);
        if(SrcBuffer.empty()) break;

        DataPosInt = 0;
        BufferListItem = BufferListItem->mNext.load(std::memory_order_acquire);
        if(!BufferListItem) BufferListItem = BufferLoopItem;
    }

    return SrcBuffer.begin();
}